

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O1

size_t Map_EnumObjects(PCASC_MAP pMap,void **ppvArray)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  
  if (ppvArray != (void **)0x0 && pMap != (PCASC_MAP)0x0) {
    sVar1 = pMap->TableSize;
    if (sVar1 != 0) {
      sVar2 = 0;
      lVar3 = 0;
      do {
        if (pMap->HashTable[sVar2] != (void *)0x0) {
          ppvArray[lVar3] = pMap->HashTable[sVar2];
          lVar3 = lVar3 + 1;
        }
        sVar2 = sVar2 + 1;
      } while (sVar1 != sVar2);
    }
    return pMap->ItemCount;
  }
  return 0;
}

Assistant:

size_t Map_EnumObjects(PCASC_MAP pMap, void **ppvArray)
{
    size_t nIndex = 0;

    // Verify pointer to the map
    if(pMap != NULL && ppvArray != NULL)
    {
        // Enumerate all items in main table
        for(size_t i = 0; i < pMap->TableSize; i++)
        {
            // Is that cell valid?
            if(pMap->HashTable[i] != NULL)
            {
                ppvArray[nIndex++] = pMap->HashTable[i];
            }
        }

        return pMap->ItemCount;
    }

    return 0;
}